

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpsession.cpp
# Opt level: O0

int __thiscall jrtplib::RTPSession::SendPacket(RTPSession *this,void *data,size_t len)

{
  uint8_t *data_00;
  size_t len_00;
  int status;
  size_t len_local;
  void *data_local;
  RTPSession *this_local;
  
  if ((this->created & 1U) == 0) {
    this_local._4_4_ = -0x3e;
  }
  else {
    this_local._4_4_ = RTPPacketBuilder::BuildPacket(&this->packetbuilder,data,len);
    if (-1 < this_local._4_4_) {
      data_00 = RTPPacketBuilder::GetPacket(&this->packetbuilder);
      len_00 = RTPPacketBuilder::GetPacketLength(&this->packetbuilder);
      this_local._4_4_ = SendRTPData(this,data_00,len_00);
      if (-1 < this_local._4_4_) {
        RTPSources::SentRTPPacket(&(this->sources).super_RTPSources);
        this->sentpackets = true;
        this_local._4_4_ = 0;
      }
    }
  }
  return this_local._4_4_;
}

Assistant:

int RTPSession::SendPacket(const void *data,size_t len)
{
	int status;
	
	if (!created)
		return ERR_RTP_SESSION_NOTCREATED;

	BUILDER_LOCK
	if ((status = packetbuilder.BuildPacket(data,len)) < 0)
	{
		BUILDER_UNLOCK
		return status;
	}
	if ((status = SendRTPData(packetbuilder.GetPacket(),packetbuilder.GetPacketLength())) < 0)
	{
		BUILDER_UNLOCK
		return status;
	}
	BUILDER_UNLOCK

	SOURCES_LOCK
	sources.SentRTPPacket();
	SOURCES_UNLOCK
	PACKSENT_LOCK
	sentpackets = true;
	PACKSENT_UNLOCK
	return 0;
}